

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::populateRenderGroup(TestCaseGroup *testGroup,Type wsiType)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Type local_14;
  TestCaseGroup *pTStack_10;
  Type wsiType_local;
  TestCaseGroup *testGroup_local;
  
  local_14 = wsiType;
  pTStack_10 = testGroup;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"basic",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Basic Rendering Test",&local_71);
  addFunctionCaseWithPrograms<vk::wsi::Type>
            (testGroup,&local_38,&local_70,getBasicRenderPrograms,basicRenderTest,local_14);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void populateRenderGroup (tcu::TestCaseGroup* testGroup, Type wsiType)
{
	addFunctionCaseWithPrograms(testGroup, "basic", "Basic Rendering Test", getBasicRenderPrograms, basicRenderTest, wsiType);
}